

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osdtext.cpp
# Opt level: O2

GLuint __thiscall CS248::OSDText::compile_shaders(OSDText *this)

{
  GLuint GVar1;
  GLuint GVar2;
  GLuint GVar3;
  int iVar4;
  char *__s;
  allocator_type local_c1;
  int info_length;
  GLint result;
  vector<char,_std::allocator<char>_> vert_shader_errmsg;
  char *src;
  string frag_shader_src;
  string vert_shader_src;
  string version;
  
  GVar1 = (*__glewCreateShader)(0x8b31);
  GVar2 = (*__glewCreateShader)(0x8b30);
  std::__cxx11::string::string((string *)&version,"#version 130\n",(allocator *)&vert_shader_src);
  std::__cxx11::string::string
            ((string *)&frag_shader_src,
             "in vec4 coord;\nout vec2 texpos;\nvoid main(void) {\n  gl_Position = vec4(coord.xy, 0, 1);\n  texpos = coord.zw;\n}"
             ,(allocator *)&vert_shader_errmsg);
  std::operator+(&vert_shader_src,&version,&frag_shader_src);
  std::__cxx11::string::~string((string *)&frag_shader_src);
  std::__cxx11::string::string
            ((string *)&vert_shader_errmsg,
             "uniform sampler2D tex;\nuniform vec4 color;\nin vec2 texpos;\nout vec4 fragColor;\nvoid main(void) {\n  fragColor = vec4(1, 1, 1, texture(tex, texpos).r) * color;\n}"
             ,(allocator *)&src);
  std::operator+(&frag_shader_src,&version,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &vert_shader_errmsg);
  std::__cxx11::string::~string((string *)&vert_shader_errmsg);
  result = 0;
  src = vert_shader_src._M_dataplus._M_p;
  (*__glewShaderSource)(GVar1,1,&src,(GLint *)0x0);
  (*__glewCompileShader)(GVar1);
  (*__glewGetShaderiv)(GVar1,0x8b81,&result);
  (*__glewGetShaderiv)(GVar1,0x8b84,&info_length);
  if (0 < info_length) {
    std::vector<char,_std::allocator<char>_>::vector
              (&vert_shader_errmsg,(ulong)(uint)info_length + 1,&local_c1);
    (*__glewGetShaderInfoLog)
              (GVar1,info_length,(GLsizei *)0x0,
               (GLchar *)
               CONCAT44(vert_shader_errmsg.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_start._4_4_,
                        (int)vert_shader_errmsg.super__Vector_base<char,_std::allocator<char>_>.
                             _M_impl.super__Vector_impl_data._M_start));
    puts((char *)CONCAT44(vert_shader_errmsg.super__Vector_base<char,_std::allocator<char>_>._M_impl
                          .super__Vector_impl_data._M_start._4_4_,
                          (int)vert_shader_errmsg.super__Vector_base<char,_std::allocator<char>_>.
                               _M_impl.super__Vector_impl_data._M_start));
    std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
              (&vert_shader_errmsg.super__Vector_base<char,_std::allocator<char>_>);
  }
  src = frag_shader_src._M_dataplus._M_p;
  (*__glewShaderSource)(GVar2,1,&src,(GLint *)0x0);
  (*__glewCompileShader)(GVar2);
  (*__glewGetShaderiv)(GVar2,0x8b81,&result);
  (*__glewGetShaderiv)(GVar2,0x8b84,&info_length);
  if (0 < info_length) {
    std::vector<char,_std::allocator<char>_>::vector
              (&vert_shader_errmsg,(ulong)(uint)info_length + 1,&local_c1);
    (*__glewGetShaderInfoLog)
              (GVar2,info_length,(GLsizei *)0x0,
               (GLchar *)
               CONCAT44(vert_shader_errmsg.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_start._4_4_,
                        (int)vert_shader_errmsg.super__Vector_base<char,_std::allocator<char>_>.
                             _M_impl.super__Vector_impl_data._M_start));
    puts((char *)CONCAT44(vert_shader_errmsg.super__Vector_base<char,_std::allocator<char>_>._M_impl
                          .super__Vector_impl_data._M_start._4_4_,
                          (int)vert_shader_errmsg.super__Vector_base<char,_std::allocator<char>_>.
                               _M_impl.super__Vector_impl_data._M_start));
    std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
              (&vert_shader_errmsg.super__Vector_base<char,_std::allocator<char>_>);
  }
  GVar3 = (*__glewCreateProgram)();
  (*__glewAttachShader)(GVar3,GVar1);
  (*__glewAttachShader)(GVar3,GVar2);
  (*__glewLinkProgram)(GVar3);
  (*__glewGetProgramiv)(GVar3,0x8b82,&result);
  (*__glewGetProgramiv)(GVar3,0x8b84,&info_length);
  if (0 < info_length) {
    std::vector<char,_std::allocator<char>_>::vector
              (&vert_shader_errmsg,(ulong)(uint)info_length + 1,&local_c1);
    (*__glewGetProgramInfoLog)
              (GVar3,info_length,(GLsizei *)0x0,
               (GLchar *)
               CONCAT44(vert_shader_errmsg.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_start._4_4_,
                        (int)vert_shader_errmsg.super__Vector_base<char,_std::allocator<char>_>.
                             _M_impl.super__Vector_impl_data._M_start));
    puts((char *)CONCAT44(vert_shader_errmsg.super__Vector_base<char,_std::allocator<char>_>._M_impl
                          .super__Vector_impl_data._M_start._4_4_,
                          (int)vert_shader_errmsg.super__Vector_base<char,_std::allocator<char>_>.
                               _M_impl.super__Vector_impl_data._M_start));
    std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
              (&vert_shader_errmsg.super__Vector_base<char,_std::allocator<char>_>);
  }
  if (result == 0) {
    (*__glewGetProgramiv)(GVar3,0x8b84,(GLint *)&vert_shader_errmsg);
    iVar4 = -1;
    if (-1 < (int)vert_shader_errmsg.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_start) {
      iVar4 = (int)vert_shader_errmsg.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start;
    }
    __s = (char *)operator_new__((long)iVar4);
    (*__glewGetProgramInfoLog)
              (GVar3,(int)vert_shader_errmsg.super__Vector_base<char,_std::allocator<char>_>._M_impl
                          .super__Vector_impl_data._M_start,(GLsizei *)&vert_shader_errmsg,__s);
    puts("GLSL Linker Error:");
    puts("================================================================================");
    puts(__s);
    putchar(10);
    operator_delete__(__s);
  }
  std::__cxx11::string::~string((string *)&frag_shader_src);
  std::__cxx11::string::~string((string *)&vert_shader_src);
  std::__cxx11::string::~string((string *)&version);
  return GVar3;
}

Assistant:

GLuint OSDText::compile_shaders() {

  // create the shaders
  GLuint vert_shader = glCreateShader(GL_VERTEX_SHADER);
  GLuint frag_shader = glCreateShader(GL_FRAGMENT_SHADER);

#ifdef __APPLE__
  std::string version = "#version 150\n";
#else
  std::string version = "#version 130\n";
#endif

  std::string vert_shader_src = version + std::string("in vec4 coord;"
  "\nout vec2 texpos;"
  "\nvoid main(void) {"
  "\n  gl_Position = vec4(coord.xy, 0, 1);"
  "\n  texpos = coord.zw;"
  "\n}");

  std::string frag_shader_src = version + std::string("uniform sampler2D tex;"
  "\nuniform vec4 color;"
  "\nin vec2 texpos;"
  "\nout vec4 fragColor;"
  "\nvoid main(void) {"
  "\n  fragColor = vec4(1, 1, 1, texture(tex, texpos).r) * color;"
  "\n}");

// with drop shadow
//  "\nvarying vec2 texpos;"
//  "\nuniform sampler2D tex;"
//  "\nuniform vec4 color;"
//  "\n"
//  "\nconst float smoothing = 1.0/4.0;"
//  "\nconst vec2 shadowOffset = vec2(-1.0/512.0);"
//  "\nconst vec4 glowColor = vec4(vec3(0.1), 1.0);"
//  "\nconst float glowMin = 0.2;"
//  "\nconst float glowMax = 0.8;"
//  "\n"
//  "\n// drop shadow computed in fragment shader"
//  "\nvoid main() {"
//  "\n    vec4 texColor = texture2D(tex, texpos);"
//  "\n    float dst = texColor.a;"
//  "\n    float alpha = smoothstep(0.5 - smoothing, 0.5 + smoothing, dst);"
//  "\n"
//  "\n    float glowDst = texture2D(tex, texpos + shadowOffset).a;"
//  "\n    vec4 glow = glowColor * smoothstep(glowMin, glowMax, glowDst);"
//  "\n"
//  "\n    float mask = 1.0-alpha;"
//  "\n"
//  "\n    vec4 base = color * vec4(vec3(1.0), dst);"
//  "\n    gl_FragColor = mix(base, glow, mask);"
//  "\n}";

  GLint result = GL_FALSE;
  int info_length;

  // compile Vertex Shader
  const char* src = vert_shader_src.c_str();
  glShaderSource(vert_shader, 1, &src, NULL);
  glCompileShader(vert_shader);

  // check Vertex Shader
  glGetShaderiv(vert_shader, GL_COMPILE_STATUS, &result);
  glGetShaderiv(vert_shader, GL_INFO_LOG_LENGTH, &info_length);
  if ( info_length > 0 ){
    vector<char> vert_shader_errmsg(info_length+1);
    glGetShaderInfoLog(vert_shader, info_length, NULL, &vert_shader_errmsg[0]);
    printf("%s\n", &vert_shader_errmsg[0]);
  }

  // compile Fragment Shader
  src = frag_shader_src.c_str();
  glShaderSource(frag_shader, 1, &src, NULL);
  glCompileShader(frag_shader);

  // check Fragment Shader
  glGetShaderiv(frag_shader, GL_COMPILE_STATUS, &result);
  glGetShaderiv(frag_shader, GL_INFO_LOG_LENGTH, &info_length);
  if ( info_length > 0 ){
    vector<char> frag_shader_errmsg(info_length+1);
    glGetShaderInfoLog(frag_shader, info_length, NULL, &frag_shader_errmsg[0]);
    printf("%s\n", &frag_shader_errmsg[0]);
  }

  // link the program
  GLuint program_id = glCreateProgram();
  glAttachShader(program_id, vert_shader);
  glAttachShader(program_id, frag_shader);
  glLinkProgram(program_id);

  // check the program
  glGetProgramiv(program_id, GL_LINK_STATUS, &result);
  glGetProgramiv(program_id, GL_INFO_LOG_LENGTH, &info_length);
  if ( info_length > 0 ){
    vector<char> program_errmsg(info_length+1);
    glGetProgramInfoLog(program_id, info_length, NULL, &program_errmsg[0]);
    printf("%s\n", &program_errmsg[0]);
  }

  if (!result) {
    // get the length of the error message
    GLint errorMessageLength;
    glGetProgramiv(program_id, GL_INFO_LOG_LENGTH, &errorMessageLength);

    // get the error message itself
    char* errorMessage = new char[errorMessageLength];
    glGetProgramInfoLog(program_id, errorMessageLength, &errorMessageLength, errorMessage);

    // print it
    printf("GLSL Linker Error:\n");
    printf("================================================================================\n");
    printf("%s\n", errorMessage);
    printf("\n");

    delete [] errorMessage;
  }


  // glDetachShader(1, vert_shader);
  // glDetachShader(1, frag_shader);
  // glDeleteShader(vert_shader);
  // glDeleteShader(frag_shader);

  return program_id;
}